

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfTiledInputFile.cpp
# Opt level: O2

void __thiscall
Imf_3_4::anon_unknown_13::TileProcess::run_decode
          (TileProcess *this,exr_const_context_t ctxt,int pn,FrameBuffer *outfb,
          vector<Imf_3_4::Slice,_std::allocator<Imf_3_4::Slice>_> *filllist)

{
  undefined8 *puVar1;
  bool bVar2;
  PixelType PVar3;
  long lVar4;
  size_t sVar5;
  TileProcess *pTVar6;
  exr_const_context_t p_Var7;
  int iVar8;
  int iVar9;
  Slice *pSVar10;
  ulong uVar11;
  ArgExc *this_00;
  size_t sVar12;
  code *pcVar13;
  long lVar14;
  undefined *puVar15;
  ulong uVar16;
  long lVar17;
  pointer pSVar18;
  float *pfVar19;
  ulong uVar20;
  float *pfVar21;
  half local_82;
  pointer local_80;
  int local_74;
  int tileY;
  int tileX;
  ulong local_68;
  ulong local_60;
  vector<Imf_3_4::Slice,_std::allocator<Imf_3_4::Slice>_> *local_58;
  TileProcess *local_50;
  exr_const_context_t local_48;
  exr_attr_box2i_t dw;
  
  local_80 = (pointer)CONCAT71(local_80._1_7_,*this);
  if (*this == (TileProcess)0x1) {
    iVar8 = exr_decoding_initialize();
    if (iVar8 == 0) {
      *this = (TileProcess)0x0;
LAB_0019ea13:
      iVar8 = exr_get_data_window(ctxt,pn,&dw);
      if (iVar8 == 0) {
        local_74 = pn;
        local_58 = filllist;
        local_50 = this + 0x48;
        local_48 = ctxt;
        iVar8 = exr_get_tile_sizes(ctxt,pn,this[0x1c],this[0x1d],&tileX,&tileY);
        if (iVar8 == 0) {
          local_60 = (long)*(int *)(this + 0xc) * (long)tileX + (long)dw.min.x;
          local_68 = (long)*(int *)(this + 0x10) * (long)tileY + (long)dw.min.y;
          *(undefined8 *)(this + 0xa8) = 0;
          lVar17 = 0x28;
          for (lVar14 = 0; p_Var7 = local_48, pTVar6 = local_50, iVar8 = local_74,
              lVar14 < *(short *)(this + 0x58); lVar14 = lVar14 + 1) {
            lVar4 = *(long *)(this + 0x50);
            pSVar10 = FrameBuffer::findSlice(outfb,*(char **)(lVar4 + -0x28 + lVar17));
            if ((pSVar10 == (Slice *)0x0) || (*(int *)(lVar4 + -0x20 + lVar17) == 0)) {
              puVar1 = (undefined8 *)(lVar4 + -8 + lVar17);
              *puVar1 = 0;
              puVar1[1] = 0;
            }
            else {
              if ((pSVar10->xSampling != 1) || (pSVar10->ySampling != 1)) {
                this_00 = (ArgExc *)__cxa_allocate_exception(0x48);
                Iex_3_4::ArgExc::ArgExc(this_00,"Tiled data should not have subsampling.");
                goto LAB_0019ecc5;
              }
              PVar3 = pSVar10->type;
              uVar11 = local_60;
              if (pSVar10->xTileCoords != false) {
                uVar11 = 0;
              }
              bVar2 = pSVar10->yTileCoords;
              *(ushort *)(lVar4 + -0xc + lVar17) = (ushort)(PVar3 != HALF) * 2 + 2;
              *(short *)(lVar4 + -10 + lVar17) = (short)PVar3;
              sVar12 = pSVar10->xStride;
              *(int *)(lVar4 + -8 + lVar17) = (int)sVar12;
              sVar5 = pSVar10->yStride;
              uVar16 = local_68;
              if (bVar2 != false) {
                uVar16 = 0;
              }
              *(int *)(lVar4 + -4 + lVar17) = (int)sVar5;
              *(char **)(lVar4 + lVar17) = pSVar10->base + uVar16 * sVar5 + uVar11 * sVar12;
            }
            lVar17 = lVar17 + 0x30;
          }
          if ((char)local_80 != '\0') {
            iVar9 = exr_decoding_choose_default_routines(local_48,local_74,local_50);
            if (iVar9 != 0) {
              this_00 = (ArgExc *)__cxa_allocate_exception(0x48);
              Iex_3_4::IoExc::IoExc((IoExc *)this_00,"Unable to choose decoder routines");
              goto LAB_0019edbc;
            }
          }
          iVar8 = exr_decoding_run(p_Var7,iVar8,pTVar6);
          if (iVar8 != 0) {
            this_00 = (ArgExc *)__cxa_allocate_exception(0x48);
            Iex_3_4::IoExc::IoExc((IoExc *)this_00,"Unable to run decoder");
            goto LAB_0019edbc;
          }
          pSVar18 = (local_58->super__Vector_base<Imf_3_4::Slice,_std::allocator<Imf_3_4::Slice>_>).
                    _M_impl.super__Vector_impl_data._M_start;
          local_80 = (local_58->super__Vector_base<Imf_3_4::Slice,_std::allocator<Imf_3_4::Slice>_>)
                     ._M_impl.super__Vector_impl_data._M_finish;
          while( true ) {
            if (pSVar18 == local_80) {
              return;
            }
            if ((pSVar18->xSampling != 1) || (pSVar18->ySampling != 1)) break;
            uVar16 = 0;
            uVar11 = local_60;
            if (pSVar18->xTileCoords != false) {
              uVar11 = uVar16;
            }
            sVar12 = pSVar18->xStride;
            uVar20 = local_68;
            if (pSVar18->yTileCoords != false) {
              uVar20 = uVar16;
            }
            pfVar21 = (float *)(pSVar18->base + uVar20 * pSVar18->yStride + uVar11 * sVar12);
            while (iVar8 = (int)uVar16, iVar8 < *(int *)(this + 0x14)) {
              if (iVar8 % pSVar18->ySampling == 0) {
                pfVar19 = pfVar21;
                for (iVar9 = 0; iVar9 < *(int *)(this + 0x18); iVar9 = iVar9 + 1) {
                  if (iVar9 % pSVar18->xSampling == 0) {
                    PVar3 = pSVar18->type;
                    if (PVar3 == FLOAT) {
                      *pfVar19 = (float)pSVar18->fillValue;
                    }
                    else if (PVar3 == HALF) {
                      Imath_3_2::half::half(&local_82,(float)pSVar18->fillValue);
                      *(uint16_t *)pfVar19 = local_82._h;
                      sVar12 = pSVar18->xStride;
                    }
                    else {
                      if (PVar3 != UINT) {
                        this_00 = (ArgExc *)__cxa_allocate_exception(0x48);
                        Iex_3_4::ArgExc::ArgExc(this_00,"Unknown pixel data type.");
                        goto LAB_0019ecc5;
                      }
                      *pfVar19 = (float)(long)pSVar18->fillValue;
                    }
                    pfVar19 = (float *)((long)pfVar19 + sVar12);
                  }
                }
                pfVar21 = (float *)((long)pfVar21 + pSVar18->yStride);
              }
              uVar16 = (ulong)(iVar8 + 1);
            }
            pSVar18 = pSVar18 + 1;
          }
          this_00 = (ArgExc *)__cxa_allocate_exception(0x48);
          Iex_3_4::ArgExc::ArgExc(this_00,"Tiled data should not have subsampling.");
        }
        else {
          this_00 = (ArgExc *)__cxa_allocate_exception(0x48);
          Iex_3_4::ArgExc::ArgExc(this_00,"Unable to query the data window.");
        }
      }
      else {
        this_00 = (ArgExc *)__cxa_allocate_exception(0x48);
        Iex_3_4::ArgExc::ArgExc(this_00,"Unable to query the data window.");
      }
LAB_0019ecc5:
      puVar15 = &Iex_3_4::ArgExc::typeinfo;
      pcVar13 = Iex_3_4::ArgExc::~ArgExc;
      goto LAB_0019ecd3;
    }
    this_00 = (ArgExc *)__cxa_allocate_exception(0x48);
    Iex_3_4::IoExc::IoExc((IoExc *)this_00,"Unable to initialize decode pipeline");
  }
  else {
    iVar8 = exr_decoding_update(ctxt,pn,this + 8,this + 0x48);
    if (iVar8 == 0) goto LAB_0019ea13;
    this_00 = (ArgExc *)__cxa_allocate_exception(0x48);
    Iex_3_4::IoExc::IoExc((IoExc *)this_00,"Unable to update decode pipeline");
  }
LAB_0019edbc:
  puVar15 = &Iex_3_4::IoExc::typeinfo;
  pcVar13 = Iex_3_4::IoExc::~IoExc;
LAB_0019ecd3:
  __cxa_throw(this_00,puVar15,pcVar13);
}

Assistant:

void TileProcess::run_decode (
    exr_const_context_t ctxt,
    int pn,
    const FrameBuffer *outfb,
    const std::vector<Slice> &filllist)
{
    int absX, absY, tileX, tileY;
    exr_attr_box2i_t dw;

    // stash the flag off to make sure to clean up in the event
    // of an exception by changing the flag after init...
    bool isfirst = first;
    if (first)
    {
        if (EXR_ERR_SUCCESS !=
            exr_decoding_initialize (ctxt, pn, &cinfo, &decoder))
        {
            throw IEX_NAMESPACE::IoExc ("Unable to initialize decode pipeline");
        }

        first = false;
    }
    else
    {
        if (EXR_ERR_SUCCESS !=
            exr_decoding_update (ctxt, pn, &cinfo, &decoder))
        {
            throw IEX_NAMESPACE::IoExc ("Unable to update decode pipeline");
        }
    }

    if (EXR_ERR_SUCCESS != exr_get_data_window (ctxt, pn, &dw))
        throw IEX_NAMESPACE::ArgExc ("Unable to query the data window.");

    if (EXR_ERR_SUCCESS != exr_get_tile_sizes (
            ctxt, pn, cinfo.level_x, cinfo.level_y, &tileX, &tileY))
        throw IEX_NAMESPACE::ArgExc ("Unable to query the data window.");

    absX = dw.min.x + tileX * cinfo.start_x;
    absY = dw.min.y + tileY * cinfo.start_y;

    update_pointers (outfb, dw.min.x, dw.min.y, absX, absY);

    if (isfirst)
    {
        if (EXR_ERR_SUCCESS !=
            exr_decoding_choose_default_routines (ctxt, pn, &decoder))
        {
            throw IEX_NAMESPACE::IoExc ("Unable to choose decoder routines");
        }
    }

    if (EXR_ERR_SUCCESS != exr_decoding_run (ctxt, pn, &decoder))
        throw IEX_NAMESPACE::IoExc ("Unable to run decoder");

    run_fill (outfb, dw.min.x, dw.min.y, absX, absY, filllist);
}